

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.hpp
# Opt level: O3

void __thiscall
OpenMD::Element::Element
          (Element *this,int num,char *sym,RealType ARENeg,RealType rcov,RealType rvdw,int maxbo,
          RealType mass,RealType elNeg,RealType ionize,RealType elAffin,RealType red,RealType green,
          RealType blue,string *name)

{
  pointer pcVar1;
  
  this->num_ = num;
  (this->symbol_)._M_dataplus._M_p = (pointer)&(this->symbol_).field_2;
  (this->symbol_)._M_string_length = 0;
  (this->symbol_).field_2._M_local_buf[0] = '\0';
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name_,pcVar1,pcVar1 + name->_M_string_length);
  this->Rcov_ = rcov;
  this->Rvdw_ = rvdw;
  this->mass_ = mass;
  this->elNeg_ = elNeg;
  this->ARENeg_ = ARENeg;
  this->ionize_ = ionize;
  this->elAffinity_ = elAffin;
  this->red_ = red;
  this->green_ = green;
  this->blue_ = blue;
  this->maxbonds_ = maxbo;
  std::__cxx11::string::_M_replace
            ((ulong)&this->symbol_,0,(char *)(this->symbol_)._M_string_length,(ulong)sym);
  return;
}

Assistant:

Element(int num, const char* sym, RealType ARENeg, RealType rcov,
            RealType rvdw, int maxbo, RealType mass, RealType elNeg,
            RealType ionize, RealType elAffin, RealType red, RealType green,
            RealType blue, std::string name) :
        num_(num),
        name_(name), Rcov_(rcov), Rvdw_(rvdw), mass_(mass), elNeg_(elNeg),
        ARENeg_(ARENeg), ionize_(ionize), elAffinity_(elAffin), red_(red),
        green_(green), blue_(blue), maxbonds_(maxbo) {
      symbol_.assign(sym, 3);
    }